

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

void __thiscall Rml::ElementDocument::~ElementDocument(ElementDocument *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementDocument_003358c0;
  this_00 = (this->style_sheet_container).
            super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->source_url)._M_dataplus._M_p;
  paVar1 = &(this->source_url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->title)._M_dataplus._M_p;
  paVar1 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Element::~Element(&this->super_Element);
  return;
}

Assistant:

ElementDocument::~ElementDocument() {}